

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  uint uVar2;
  voidpf pvVar3;
  uint uVar4;
  uint uVar5;
  
  piVar1 = strm->state;
  if (*(long *)(piVar1 + 0x10) == 0) {
    pvVar3 = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1[0xc].dummy & 0x1f),1);
    *(voidpf *)(piVar1 + 0x10) = pvVar3;
    if (pvVar3 == (voidpf)0x0) {
      return 1;
    }
  }
  if (piVar1[0xd].dummy == 0) {
    piVar1[0xd].dummy = 1 << ((byte)piVar1[0xc].dummy & 0x1f);
    *(undefined8 *)(piVar1 + 0xe) = 0;
  }
  uVar4 = out - strm->avail_out;
  uVar5 = piVar1[0xd].dummy;
  if (uVar4 < uVar5) {
    uVar5 = uVar5 - piVar1[0xf].dummy;
    uVar2 = uVar4;
    if (uVar5 < uVar4) {
      uVar2 = uVar5;
    }
    memcpy((void *)((ulong)(uint)piVar1[0xf].dummy + *(long *)(piVar1 + 0x10)),
           strm->next_out + -(ulong)uVar4,(ulong)uVar2);
    if (uVar4 <= uVar5) {
      uVar5 = piVar1[0xf].dummy + uVar2;
      if (uVar5 == piVar1[0xd].dummy) {
        uVar5 = 0;
      }
      piVar1[0xf].dummy = uVar5;
      if ((uint)piVar1[0xd].dummy <= (uint)piVar1[0xe].dummy) {
        return 0;
      }
      piVar1[0xe].dummy = piVar1[0xe].dummy + uVar2;
      return 0;
    }
    uVar4 = uVar4 - uVar2;
    memcpy(*(void **)(piVar1 + 0x10),strm->next_out + -(ulong)uVar4,(ulong)uVar4);
    piVar1[0xf].dummy = uVar4;
  }
  else {
    memcpy(*(void **)(piVar1 + 0x10),strm->next_out + -(ulong)uVar5,(ulong)uVar5);
    piVar1[0xf].dummy = 0;
  }
  piVar1[0xe].dummy = piVar1[0xd].dummy;
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, unsigned out)
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}